

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O3

int my_trace(CURL *handle,curl_infotype type,char *data,size_t size,void *userp)

{
  char cVar1;
  FILE *__stream;
  char cVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  data *config;
  ulong uVar8;
  
  __stream = _stderr;
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"== Info: %s",data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar4 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar4 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar4 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar4 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar4 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar4 = "=> Send SSL data";
    break;
  default:
    goto switchD_001024b0_default;
  }
  cVar1 = *userp;
  curl_mfprintf(_stderr,"%s, %d bytes (0x%x)\n",pcVar4,size & 0xffffffff,size & 0xffffffff);
  if (size != 0) {
    lVar3 = 0x40;
    if (cVar1 == '\0') {
      lVar3 = 0x10;
    }
    uVar8 = 0;
    do {
      curl_mfprintf(__stream,"%04x: ",uVar8 & 0xffffffff);
      uVar6 = uVar8;
      lVar5 = lVar3;
      if (cVar1 == '\0') {
        do {
          if (uVar6 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar6]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar5 = lVar5 + -1;
          uVar6 = uVar6 + 1;
        } while (lVar5 != 0);
      }
      lVar5 = 0;
      lVar7 = 0;
      pcVar4 = data + 2;
      do {
        if (size <= uVar8 + lVar7) break;
        if (cVar1 == '\0') {
          cVar2 = pcVar4[uVar8 - 2];
          if (cVar2 < ' ') {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
        }
        else {
          cVar2 = pcVar4[uVar8 - 2];
          if ((uVar8 + lVar7 + 1 < size) && (cVar2 == '\r')) {
            cVar2 = '.';
            if (pcVar4[uVar8 - 1] == '\n') {
              uVar8 = (uVar8 - lVar5) - 0x3e;
              break;
            }
          }
          else if (cVar2 < ' ') {
            cVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",cVar2);
          if (((uVar8 + lVar7 + 2 < size) && (pcVar4[uVar8 - 1] == '\r')) && (pcVar4[uVar8] == '\n')
             ) {
            uVar8 = (uVar8 - lVar5) - 0x3d;
            break;
          }
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + -1;
        pcVar4 = pcVar4 + 1;
      } while (-lVar3 != lVar5);
      fputc(10,__stream);
      uVar8 = uVar8 + lVar3;
    } while (uVar8 < size);
  }
  fflush(__stream);
switchD_001024b0_default:
  return 0;
}

Assistant:

static
int my_trace(CURL *handle, curl_infotype type,
             char *data, size_t size,
             void *userp)
{
  struct data *config = (struct data *)userp;
  const char *text;
  (void)handle; /* prevent compiler warning */

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "== Info: %s", (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  dump(text, stderr, (unsigned char *)data, size, config->trace_ascii);
  return 0;
}